

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::anon_unknown_14::XmlReporter::log_contexts(XmlReporter *this)

{
  XmlWriter *in_RDI;
  int i;
  stringstream ss;
  IContextScope **contexts;
  int num_contexts;
  ScopedElement *in_stack_fffffffffffffda0;
  string *text;
  ScopedElement *this_00;
  string *name;
  allocator<char> *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  string local_208 [39];
  undefined8 local_1e1;
  int local_1a4;
  stringstream local_1a0 [16];
  string asStack_190 [11];
  IContextScope **local_18;
  int local_c;
  
  local_c = IReporter::get_num_active_contexts();
  if (local_c != 0) {
    local_18 = IReporter::get_active_contexts();
    std::__cxx11::stringstream::stringstream(local_1a0);
    for (local_1a4 = 0; local_1a4 < local_c; local_1a4 = local_1a4 + 1) {
      name = (string *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x1a0) {
        name = asStack_190;
      }
      (*local_18[local_1a4]->_vptr_IContextScope[2])(local_18[local_1a4],name);
      text = (string *)&in_RDI->m_tags;
      this_00 = (ScopedElement *)&local_1e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      XmlWriter::scopedElement(in_RDI,name);
      std::__cxx11::stringstream::str();
      XmlWriter::ScopedElement::writeText
                (this_00,text,SUB81((ulong)in_stack_fffffffffffffda0 >> 0x38,0));
      std::__cxx11::string::~string(local_208);
      XmlWriter::ScopedElement::~ScopedElement(in_stack_fffffffffffffda0);
      std::__cxx11::string::~string((string *)((long)&local_1e1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
      in_stack_fffffffffffffda0 = (ScopedElement *)&stack0xfffffffffffffdd7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      std::__cxx11::stringstream::str((string *)local_1a0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdd7);
    }
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  return;
}

Assistant:

void log_contexts() {
            int num_contexts = get_num_active_contexts();
            if(num_contexts) {
                auto              contexts = get_active_contexts();
                std::stringstream ss;
                for(int i = 0; i < num_contexts; ++i) {
                    contexts[i]->stringify(&ss);
                    xml.scopedElement("Info").writeText(ss.str());
                    ss.str("");
                }
            }
        }